

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzeuleranalysis.cpp
# Opt level: O2

void __thiscall
TPZEulerAnalysis::SetGMResFront(TPZEulerAnalysis *this,REAL tol,int numiter,int numvectors)

{
  TPZBaseMatrix *rhs;
  TPZMatrix<double> *pTVar1;
  TPZAutoPointer<TPZBaseMatrix> TStack_3e8;
  TPZAutoPointer<TPZMatrix<double>_> local_3e0;
  TPZAutoPointer<TPZBaseMatrix> local_3d8;
  TPZAutoPointer<TPZMatrix<double>_> local_3d0;
  TPZAutoPointer<TPZGuiInterface> local_3c8;
  REAL local_3c0;
  TPZSpStructMatrix<double,_TPZStructMatrixOR<double>_> StrMatrix;
  TPZStepSolver<double> Solver;
  TPZStepSolver<double> FrontSolver;
  TPZFrontStructMatrix<TPZFrontNonSym<double>,_double,_TPZStructMatrixOR<double>_> strfront;
  
  local_3c0 = tol;
  TPZFrontStructMatrix<TPZFrontNonSym<double>,_double,_TPZStructMatrixOR<double>_>::TPZStructMatrix
            (&strfront,(this->super_TPZLinearAnalysis).super_TPZAnalysis.fCompMesh);
  TPZFrontStructMatrix<TPZFrontNonSym<double>,_double,_TPZStructMatrixOR<double>_>::SetQuiet
            (&strfront,1);
  rhs = TPZSolutionMatrix::operator_cast_to_TPZBaseMatrix_(&(this->super_TPZLinearAnalysis).fRhs);
  TPZAutoPointer<TPZGuiInterface>::TPZAutoPointer(&local_3c8,(TPZGuiInterface *)0x0);
  pTVar1 = TPZFrontStructMatrix<TPZFrontNonSym<double>,_double,_TPZStructMatrixOR<double>_>::
           CreateAssemble(&strfront,rhs,&local_3c8);
  TPZAutoPointer<TPZGuiInterface>::~TPZAutoPointer(&local_3c8);
  TPZAutoPointer<TPZMatrix<double>_>::TPZAutoPointer(&local_3d0,(TPZMatrix<double> *)0x0);
  TPZStepSolver<double>::TPZStepSolver(&FrontSolver,&local_3d0);
  TPZAutoPointer<TPZMatrix<double>_>::~TPZAutoPointer(&local_3d0);
  TPZStepSolver<double>::SetDirect(&FrontSolver,ELU);
  TPZAutoPointer<TPZBaseMatrix>::TPZAutoPointer<TPZMatrix<double>>(&local_3d8,pTVar1);
  TPZMatrixSolver<double>::SetMatrix(&FrontSolver.super_TPZMatrixSolver<double>,&local_3d8);
  TPZAutoPointer<TPZBaseMatrix>::~TPZAutoPointer(&local_3d8);
  TPZSpStructMatrix<double,_TPZStructMatrixOR<double>_>::TPZStructMatrix
            (&StrMatrix,(this->super_TPZLinearAnalysis).super_TPZAnalysis.fCompMesh);
  TPZAnalysis::SetStructuralMatrix((TPZAnalysis *)this,(TPZStructMatrix *)&StrMatrix);
  pTVar1 = TPZSpStructMatrix<double,_TPZStructMatrixOR<double>_>::Create(&StrMatrix);
  TPZAutoPointer<TPZMatrix<double>_>::TPZAutoPointer(&local_3e0,(TPZMatrix<double> *)0x0);
  TPZStepSolver<double>::TPZStepSolver(&Solver,&local_3e0);
  TPZAutoPointer<TPZMatrix<double>_>::~TPZAutoPointer(&local_3e0);
  TPZStepSolver<double>::SetGMRES
            (&Solver,(long)numiter,numvectors,&FrontSolver.super_TPZMatrixSolver<double>,local_3c0,0
            );
  TPZAutoPointer<TPZBaseMatrix>::TPZAutoPointer<TPZMatrix<double>>(&TStack_3e8,pTVar1);
  TPZMatrixSolver<double>::SetMatrix(&Solver.super_TPZMatrixSolver<double>,&TStack_3e8);
  TPZAutoPointer<TPZBaseMatrix>::~TPZAutoPointer(&TStack_3e8);
  (*(this->super_TPZLinearAnalysis).super_TPZAnalysis.super_TPZSavable._vptr_TPZSavable[0x10])
            (this,&Solver);
  this->fHasFrontalPreconditioner = 0;
  TPZStepSolver<double>::~TPZStepSolver(&Solver);
  TPZSpStructMatrix<double,_TPZStructMatrixOR<double>_>::~TPZSpStructMatrix(&StrMatrix);
  TPZStepSolver<double>::~TPZStepSolver(&FrontSolver);
  TPZFrontStructMatrix<TPZFrontNonSym<double>,_double,_TPZStructMatrixOR<double>_>::
  ~TPZFrontStructMatrix(&strfront);
  return;
}

Assistant:

void TPZEulerAnalysis::SetGMResFront(REAL tol, int numiter, int numvectors)
{
	TPZFrontStructMatrix <TPZFrontNonSym<STATE> > strfront(Mesh());
	strfront.SetQuiet(1);
	auto *front = strfront.CreateAssemble(fRhs,NULL);
	
	TPZStepSolver<STATE> FrontSolver;
	FrontSolver.SetDirect(ELU);
	FrontSolver.SetMatrix(front);
	
	
	TPZSpStructMatrix<STATE> StrMatrix(Mesh());
	//TPZFStructMatrix<STATE> StrMatrix(cmesh);
	SetStructuralMatrix(StrMatrix);
	
	auto * mat = StrMatrix.Create();
	TPZStepSolver<STATE> Solver;
	Solver.SetGMRES(numiter,
					numvectors,
					FrontSolver,
					tol,
					0);
	Solver.SetMatrix(mat);
	SetSolver(Solver);
	fHasFrontalPreconditioner = 0;
	
}